

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O0

void add_name_to_table(compile_block_8 *cb,PCRE2_SPTR8 name,int length,uint groupno,
                      uint32_t tablecount)

{
  int local_34;
  PCRE2_UCHAR8 *pPStack_30;
  int crc;
  PCRE2_UCHAR8 *slot;
  uint32_t i;
  uint32_t tablecount_local;
  uint groupno_local;
  int length_local;
  PCRE2_SPTR8 name_local;
  compile_block_8 *cb_local;
  
  pPStack_30 = cb->name_table;
  slot._0_4_ = 0;
  do {
    if (tablecount <= (uint)slot) {
LAB_00166c50:
      *pPStack_30 = (PCRE2_UCHAR8)(groupno >> 8);
      pPStack_30[1] = (PCRE2_UCHAR8)groupno;
      memcpy(pPStack_30 + 2,name,(long)length);
      memset(pPStack_30 + (long)length + 2,0,(long)(int)(((uint)cb->name_entry_size - length) + -2))
      ;
      return;
    }
    local_34 = memcmp(name,pPStack_30 + 2,(long)length);
    if ((local_34 == 0) && (pPStack_30[length + 2] != '\0')) {
      local_34 = -1;
    }
    if (local_34 < 0) {
      memmove(pPStack_30 + (int)(uint)cb->name_entry_size,pPStack_30,
              (ulong)((tablecount - (uint)slot) * (uint)cb->name_entry_size));
      goto LAB_00166c50;
    }
    pPStack_30 = pPStack_30 + (int)(uint)cb->name_entry_size;
    slot._0_4_ = (uint)slot + 1;
  } while( true );
}

Assistant:

static void
add_name_to_table(compile_block *cb, PCRE2_SPTR name, int length,
  unsigned int groupno, uint32_t tablecount)
{
uint32_t i;
PCRE2_UCHAR *slot = cb->name_table;

for (i = 0; i < tablecount; i++)
  {
  int crc = memcmp(name, slot+IMM2_SIZE, CU2BYTES(length));
  if (crc == 0 && slot[IMM2_SIZE+length] != 0)
    crc = -1; /* Current name is a substring */

  /* Make space in the table and break the loop for an earlier name. For a
  duplicate or later name, carry on. We do this for duplicates so that in the
  simple case (when ?(| is not used) they are in order of their numbers. In all
  cases they are in the order in which they appear in the pattern. */

  if (crc < 0)
    {
    (void)memmove(slot + cb->name_entry_size, slot,
      CU2BYTES((tablecount - i) * cb->name_entry_size));
    break;
    }

  /* Continue the loop for a later or duplicate name */

  slot += cb->name_entry_size;
  }

PUT2(slot, 0, groupno);
memcpy(slot + IMM2_SIZE, name, CU2BYTES(length));

/* Add a terminating zero and fill the rest of the slot with zeroes so that
the memory is all initialized. Otherwise valgrind moans about uninitialized
memory when saving serialized compiled patterns. */

memset(slot + IMM2_SIZE + length, 0,
  CU2BYTES(cb->name_entry_size - length - IMM2_SIZE));
}